

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O1

void generate<trng::mt19937_64>(size_t samples,unsigned_long seed)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  long lVar3;
  uint uVar4;
  size_t sVar5;
  mt19937_64 r;
  char local_a01;
  mt19937_64 local_a00;
  
  trng::mt19937_64::mt19937_64(&local_a00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "#==================================================================\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# generator ",0xc);
  __s = trng::mt19937_64::name();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3510d0);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  seed = ",9);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"#==================================================================\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"type: d\n",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"count: ",7);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"numbit: ",8);
  trng::int_math::log2_ceil<unsigned_long>(0xffffffffffffffff);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_a01 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_a01,1);
  if (samples != 0) {
    sVar5 = 0;
    do {
      if (0x137 < local_a00.S.mti) {
        lVar3 = -0x9c;
        do {
          uVar4 = (uint)local_a00.S.mt[lVar3 + 0x9d];
          local_a00.S.mt[lVar3 + 0x9c] =
               *(ulong *)(&DAT_0010abe0 + (ulong)(uVar4 & 1) * 8) ^
               *(ulong *)(&stack0xffffffffffffffd0 + lVar3 * 8) ^
               ((ulong)(uVar4 & 0x7ffffffe) | local_a00.S.mt[lVar3 + 0x9c] & 0xffffffff80000000) >>
               1;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0);
        lVar3 = 0;
        do {
          uVar4 = (uint)local_a00.S.mt[lVar3 + 0x9d];
          local_a00.S.mt[lVar3 + 0x9c] =
               *(ulong *)(&DAT_0010abe0 + (ulong)(uVar4 & 1) * 8) ^ local_a00.S.mt[lVar3] ^
               ((ulong)(uVar4 & 0x7ffffffe) | local_a00.S.mt[lVar3 + 0x9c] & 0xffffffff80000000) >>
               1;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x9b);
        local_a00.S.mt[0x137] =
             *(ulong *)(&DAT_0010abe0 + (ulong)((uint)local_a00.S.mt[0] & 1) * 8) ^
             local_a00.S.mt[0x9b] ^
             ((ulong)((uint)local_a00.S.mt[0] & 0x7ffffffe) |
             local_a00.S.mt[0x137] & 0xffffffff80000000) >> 1;
        local_a00.S.mti = 0;
      }
      local_a00.S.mti = local_a00.S.mti + 1;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      local_a01 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_a01,1);
      sVar5 = sVar5 + 1;
    } while (sVar5 != samples);
  }
  return;
}

Assistant:

void generate(std::size_t samples, unsigned long seed) {
  R r;
  std::cout << "#==================================================================\n"
            << "# generator " << r.name() << "  seed = " << seed << "\n"
            << "#==================================================================\n"
            << "type: d\n"
            << "count: " << samples << "\n"
            << "numbit: " << trng::int_math::log2_ceil(r.max() - r.min()) << '\n';
  for (std::size_t j{0}; j < samples; ++j)
    std::cout << r() - r.min() << '\n';
}